

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmLocalNinjaGenerator::Generate(cmLocalNinjaGenerator *this)

{
  cmNinjaDeps *outputs;
  pointer pbVar1;
  cmGlobalGenerator *pcVar2;
  cmMakefile *this_00;
  ostream *os;
  pointer puVar3;
  string *psVar4;
  cmGlobalNinjaGenerator *pcVar5;
  cmGeneratorTarget *pcVar6;
  bool bVar7;
  int iVar8;
  TargetType TVar9;
  string *psVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _Rb_tree_node_base *p_Var11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_3;
  pointer puVar12;
  pointer pbVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  cmGeneratorTarget *in_stack_fffffffffffffe08;
  long *local_1e8;
  string local_1d0;
  cmNinjaBuild phonyAlias;
  string local_90;
  string local_70;
  string local_50;
  
  psVar10 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmOutputConverter::MaybeRelativeToTopBinDir(&phonyAlias.Comment,(cmOutputConverter *)this,psVar10)
  ;
  std::__cxx11::string::operator=((string *)&this->HomeRelativeOutputPath,(string *)&phonyAlias);
  std::__cxx11::string::~string((string *)&phonyAlias);
  bVar7 = std::operator==(&this->HomeRelativeOutputPath,".");
  if (bVar7) {
    (this->HomeRelativeOutputPath)._M_string_length = 0;
    *(this->HomeRelativeOutputPath)._M_dataplus._M_p = '\0';
  }
  iVar8 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[0x28])();
  if ((char)iVar8 != '\0') {
    pbVar1 = (this->super_cmLocalCommonGenerator).ConfigNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar13 = (this->super_cmLocalCommonGenerator).ConfigNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1;
        pbVar13 = pbVar13 + 1) {
      pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
      iVar8 = (*pcVar2->_vptr_cmGlobalGenerator[0x45])(pcVar2,pbVar13);
      WriteProcessedMakefile(this,(ostream *)CONCAT44(extraout_var,iVar8));
    }
  }
  iVar8 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[0x48])();
  WriteProcessedMakefile(this,(ostream *)CONCAT44(extraout_var_00,iVar8));
  bVar7 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
  if (bVar7) {
    WriteBuildFileTop(this);
    WritePools(this,(ostream *)
                    (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                    ProjectMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&phonyAlias,"CMAKE_CL_SHOWINCLUDES_PREFIX",(allocator<char> *)&local_1d0);
    psVar10 = cmMakefile::GetSafeDefinition(this_00,&phonyAlias.Comment);
    std::__cxx11::string::~string((string *)&phonyAlias);
    if (psVar10->_M_string_length != 0) {
      os = (ostream *)
           (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].ProjectMap
           ._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&phonyAlias,"localized /showIncludes string",
                 (allocator<char> *)&local_1d0);
      cmGlobalNinjaGenerator::WriteComment(os,&phonyAlias.Comment);
      std::__cxx11::string::~string((string *)&phonyAlias);
      std::operator<<((ostream *)
                      (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1]
                      .ProjectMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      "msvc_deps_prefix = ");
      cmGeneratedFileStream::WriteAltEncoding
                ((cmGeneratedFileStream *)
                 (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                 ProjectMap._M_t._M_impl.super__Rb_tree_header._M_node_count,psVar10,ConsoleOutput);
      std::operator<<((ostream *)
                      (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1]
                      .ProjectMap._M_t._M_impl.super__Rb_tree_header._M_node_count,"\n\n");
    }
  }
  puVar3 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
           super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  outputs = &phonyAlias.ExplicitDeps;
  for (puVar12 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
                 super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar3; puVar12 = puVar12 + 1
      ) {
    bVar7 = cmGeneratorTarget::IsInBuildSystem
                      ((puVar12->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                       .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
    if ((bVar7) &&
       (cmNinjaTargetGenerator::New(in_stack_fffffffffffffe08), local_1e8 != (long *)0x0)) {
      bVar7 = cmTarget::IsPerConfig
                        (((puVar12->_M_t).
                          super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                          .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl)->Target);
      if (bVar7) {
        psVar4 = (this->super_cmLocalCommonGenerator).ConfigNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (psVar10 = (this->super_cmLocalCommonGenerator).ConfigNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar4;
            psVar10 = psVar10 + 1) {
          (**(code **)(*local_1e8 + 0x20))(local_1e8,psVar10);
          TVar9 = cmGeneratorTarget::GetType
                            ((puVar12->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                             .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          if ((TVar9 == GLOBAL_TARGET) &&
             (iVar8 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator
                        )->_vptr_cmGlobalGenerator[0x28])(), (char)iVar8 != '\0')) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,"phony",(allocator<char> *)&local_1d0);
            cmNinjaBuild::cmNinjaBuild(&phonyAlias,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            pcVar5 = (cmGlobalNinjaGenerator *)
                     (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
            pcVar6 = (puVar12->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                     .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d0,"",(allocator<char> *)&stack0xfffffffffffffe0f);
            cmGlobalNinjaGenerator::AppendTargetOutputs
                      (pcVar5,pcVar6,&phonyAlias.Outputs,&local_1d0,DependOnTargetArtifact);
            std::__cxx11::string::~string((string *)&local_1d0);
            cmGlobalNinjaGenerator::AppendTargetOutputs
                      ((cmGlobalNinjaGenerator *)
                       (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                       (puVar12->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                       .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,outputs,
                       psVar10,DependOnTargetArtifact);
            pcVar5 = (cmGlobalNinjaGenerator *)
                     (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
            iVar8 = (*(pcVar5->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                      _vptr_cmGlobalGenerator[0x46])(pcVar5,psVar10);
            cmGlobalNinjaGenerator::WriteBuild
                      (pcVar5,(ostream *)CONCAT44(extraout_var_01,iVar8),&phonyAlias,0,(bool *)0x0);
            cmNinjaBuild::~cmNinjaBuild(&phonyAlias);
          }
        }
        TVar9 = cmGeneratorTarget::GetType
                          ((puVar12->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        if ((TVar9 == GLOBAL_TARGET) &&
           (iVar8 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)
                      ->_vptr_cmGlobalGenerator[0x28])(), (char)iVar8 != '\0')) {
          if ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
              CurrentConfigureMakefile != (cmMakefile *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,"phony",(allocator<char> *)&local_1d0);
            cmNinjaBuild::cmNinjaBuild(&phonyAlias,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            pcVar5 = (cmGlobalNinjaGenerator *)
                     (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
            pcVar6 = (puVar12->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                     .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d0,"",(allocator<char> *)&stack0xfffffffffffffe0f);
            cmGlobalNinjaGenerator::AppendTargetOutputs
                      (pcVar5,pcVar6,&phonyAlias.Outputs,&local_1d0,DependOnTargetArtifact);
            std::__cxx11::string::~string((string *)&local_1d0);
            pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
            for (p_Var11 = (_Rb_tree_node_base *)
                           pcVar2[1].LocalGenerators.
                           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                p_Var11 != (_Rb_tree_node_base *)&pcVar2[1].LocalGenerators;
                p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
              cmGlobalNinjaGenerator::AppendTargetOutputs
                        ((cmGlobalNinjaGenerator *)
                         (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator
                         ,(puVar12->_M_t).
                          super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                          .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,outputs,
                         (string *)(p_Var11 + 1),DependOnTargetArtifact);
            }
            pcVar5 = (cmGlobalNinjaGenerator *)
                     (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
            iVar8 = (*(pcVar5->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                      _vptr_cmGlobalGenerator[0x47])(pcVar5);
            cmGlobalNinjaGenerator::WriteBuild
                      (pcVar5,(ostream *)CONCAT44(extraout_var_02,iVar8),&phonyAlias,0,(bool *)0x0);
            cmNinjaBuild::~cmNinjaBuild(&phonyAlias);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,"phony",(allocator<char> *)&local_1d0);
          cmNinjaBuild::cmNinjaBuild(&phonyAlias,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          pcVar5 = (cmGlobalNinjaGenerator *)
                   (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
          pcVar6 = (puVar12->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                   .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d0,"all",(allocator<char> *)&stack0xfffffffffffffe0f);
          cmGlobalNinjaGenerator::AppendTargetOutputs
                    (pcVar5,pcVar6,&phonyAlias.Outputs,&local_1d0,DependOnTargetArtifact);
          std::__cxx11::string::~string((string *)&local_1d0);
          psVar4 = (this->super_cmLocalCommonGenerator).ConfigNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (psVar10 = (this->super_cmLocalCommonGenerator).ConfigNames.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pcVar5 = (cmGlobalNinjaGenerator *)
                       (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
              psVar10 != psVar4; psVar10 = psVar10 + 1) {
            cmGlobalNinjaGenerator::AppendTargetOutputs
                      (pcVar5,(puVar12->_M_t).
                              super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                              .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                       outputs,psVar10,DependOnTargetArtifact);
          }
          iVar8 = (*(pcVar5->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[0x47])(pcVar5);
          cmGlobalNinjaGenerator::WriteBuild
                    (pcVar5,(ostream *)CONCAT44(extraout_var_03,iVar8),&phonyAlias,0,(bool *)0x0);
          cmNinjaBuild::~cmNinjaBuild(&phonyAlias);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&phonyAlias,"",(allocator<char> *)&local_1d0);
        (**(code **)(*local_1e8 + 0x20))(local_1e8,&phonyAlias);
        std::__cxx11::string::~string((string *)&phonyAlias);
      }
      if (local_1e8 != (long *)0x0) {
        (**(code **)(*local_1e8 + 8))();
      }
    }
  }
  pbVar1 = (this->super_cmLocalCommonGenerator).ConfigNames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar13 = (this->super_cmLocalCommonGenerator).ConfigNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1; pbVar13 = pbVar13 + 1
      ) {
    WriteCustomCommandBuildStatements(this,pbVar13);
    AdditionalCleanFiles(this,pbVar13);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::Generate()
{
  // Compute the path to use when referencing the current output
  // directory from the top output directory.
  this->HomeRelativeOutputPath =
    this->MaybeRelativeToTopBinDir(this->GetCurrentBinaryDirectory());
  if (this->HomeRelativeOutputPath == ".") {
    this->HomeRelativeOutputPath.clear();
  }

  if (this->GetGlobalGenerator()->IsMultiConfig()) {
    for (auto const& config : this->GetConfigNames()) {
      this->WriteProcessedMakefile(this->GetImplFileStream(config));
    }
  }
  this->WriteProcessedMakefile(this->GetCommonFileStream());
#ifdef NINJA_GEN_VERBOSE_FILES
  this->WriteProcessedMakefile(this->GetRulesFileStream());
#endif

  // We do that only once for the top CMakeLists.txt file.
  if (this->IsRootMakefile()) {
    this->WriteBuildFileTop();

    this->WritePools(this->GetRulesFileStream());

    const std::string& showIncludesPrefix =
      this->GetMakefile()->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
    if (!showIncludesPrefix.empty()) {
      cmGlobalNinjaGenerator::WriteComment(this->GetRulesFileStream(),
                                           "localized /showIncludes string");
      this->GetRulesFileStream() << "msvc_deps_prefix = ";
      // 'cl /showIncludes' encodes output in the console output code page.
      // It may differ from the encoding used for file paths in 'build.ninja'.
      // Ninja matches the showIncludes prefix using its raw byte sequence.
      this->GetRulesFileStream().WriteAltEncoding(
        showIncludesPrefix, cmGeneratedFileStream::Encoding::ConsoleOutput);
      this->GetRulesFileStream() << "\n\n";
    }
  }

  for (const auto& target : this->GetGeneratorTargets()) {
    if (!target->IsInBuildSystem()) {
      continue;
    }
    auto tg = cmNinjaTargetGenerator::New(target.get());
    if (tg) {
      if (target->Target->IsPerConfig()) {
        for (auto const& config : this->GetConfigNames()) {
          tg->Generate(config);
          if (target->GetType() == cmStateEnums::GLOBAL_TARGET &&
              this->GetGlobalGenerator()->IsMultiConfig()) {
            cmNinjaBuild phonyAlias("phony");
            this->GetGlobalNinjaGenerator()->AppendTargetOutputs(
              target.get(), phonyAlias.Outputs, "", DependOnTargetArtifact);
            this->GetGlobalNinjaGenerator()->AppendTargetOutputs(
              target.get(), phonyAlias.ExplicitDeps, config,
              DependOnTargetArtifact);
            this->GetGlobalNinjaGenerator()->WriteBuild(
              *this->GetGlobalNinjaGenerator()->GetConfigFileStream(config),
              phonyAlias);
          }
        }
        if (target->GetType() == cmStateEnums::GLOBAL_TARGET &&
            this->GetGlobalGenerator()->IsMultiConfig()) {
          if (!this->GetGlobalNinjaGenerator()->GetDefaultConfigs().empty()) {
            cmNinjaBuild phonyAlias("phony");
            this->GetGlobalNinjaGenerator()->AppendTargetOutputs(
              target.get(), phonyAlias.Outputs, "", DependOnTargetArtifact);
            for (auto const& config :
                 this->GetGlobalNinjaGenerator()->GetDefaultConfigs()) {
              this->GetGlobalNinjaGenerator()->AppendTargetOutputs(
                target.get(), phonyAlias.ExplicitDeps, config,
                DependOnTargetArtifact);
            }
            this->GetGlobalNinjaGenerator()->WriteBuild(
              *this->GetGlobalNinjaGenerator()->GetDefaultFileStream(),
              phonyAlias);
          }
          cmNinjaBuild phonyAlias("phony");
          this->GetGlobalNinjaGenerator()->AppendTargetOutputs(
            target.get(), phonyAlias.Outputs, "all", DependOnTargetArtifact);
          for (auto const& config : this->GetConfigNames()) {
            this->GetGlobalNinjaGenerator()->AppendTargetOutputs(
              target.get(), phonyAlias.ExplicitDeps, config,
              DependOnTargetArtifact);
          }
          this->GetGlobalNinjaGenerator()->WriteBuild(
            *this->GetGlobalNinjaGenerator()->GetDefaultFileStream(),
            phonyAlias);
        }
      } else {
        tg->Generate("");
      }
    }
  }

  for (auto const& config : this->GetConfigNames()) {
    this->WriteCustomCommandBuildStatements(config);
    this->AdditionalCleanFiles(config);
  }
}